

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockAtomicCounterBufferIndexContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  SharedPtrStateBase *pSVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  Node *pNVar6;
  SharedPtrStateBase *pSVar7;
  TestNode *node;
  ResourceTestCase *pRVar8;
  deInt32 *pdVar9;
  SharedPtr arrayArrayElement;
  SharedPtr arrayElement;
  SharedPtr variable;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr elementvariable;
  SharedPtr local_58;
  ProgramResourceQueryTestTarget local_48;
  SharedPtr local_40;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_48,PROGRAMINTERFACE_UNIFORM,8);
  if (parentStructure->m_ptr->m_type == TYPE_INTERFACE_BLOCK) {
    generateVariableCases(context,parentStructure,targetGroup,&local_48,1,false);
  }
  else {
    generateVariableCases(context,parentStructure,targetGroup,&local_48,3,true);
    generateOpaqueTypeCases(context,parentStructure,targetGroup,&local_48,3,true);
    pNVar2 = (Node *)operator_new(0x28);
    pNVar4 = parentStructure->m_ptr;
    pSVar3 = parentStructure->m_state;
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = pNVar4;
    (pNVar2->m_enclosingNode).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar2;
    (pNVar4->m_enclosingNode).m_state = pSVar3;
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar6->m_type = TYPE_VARIABLE;
    (pNVar6->m_enclosingNode).m_ptr = pNVar2;
    (pNVar6->m_enclosingNode).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar6[1]._vptr_Node = 0x54;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar6;
    local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_58.m_state)->strongRefCount = 0;
    (local_58.m_state)->weakRefCount = 0;
    (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_58.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
    (local_58.m_state)->strongRefCount = 1;
    (local_58.m_state)->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar4;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar9 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar9 = *pdVar9 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x54;
    local_40.m_state = (SharedPtrStateBase *)0x0;
    local_40.m_ptr = pNVar2;
    pSVar7 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar7->strongRefCount = 0;
    pSVar7->weakRefCount = 0;
    pSVar7->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar7[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar7->strongRefCount = 1;
    pSVar7->weakRefCount = 1;
    local_40.m_state = pSVar7;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,"array","Arrays");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    pRVar8 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar8,context,&local_58,&local_48,"var_array");
    tcu::TestNode::addChild(node,(TestNode *)pRVar8);
    pRVar8 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar8,context,&local_40,&local_48,"var_array_array");
    tcu::TestNode::addChild(node,(TestNode *)pRVar8);
    pSVar1 = local_40.m_state;
    pdVar9 = &pSVar7->strongRefCount;
    LOCK();
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_40.m_ptr = (Node *)0x0;
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])(local_40.m_state);
    }
    LOCK();
    pdVar9 = &pSVar1->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_40.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar1 = local_58.m_state;
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &(local_58.m_state)->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
      }
      LOCK();
      pdVar9 = &pSVar1->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSVar5->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
      }
      LOCK();
      pdVar9 = &pSVar5->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSVar5 != (SharedPtrStateBase *)0x0)) {
        (*pSVar5->_vptr_SharedPtrStateBase[1])();
      }
    }
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar9 = &pSVar3->strongRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if (*pdVar9 == 0) {
        (*pSVar3->_vptr_SharedPtrStateBase[2])(pSVar3);
      }
      LOCK();
      pdVar9 = &pSVar3->weakRefCount;
      *pdVar9 = *pdVar9 + -1;
      UNLOCK();
      if ((*pdVar9 == 0) && (pSVar3 != (SharedPtrStateBase *)0x0)) {
        (*pSVar3->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  return;
}

Assistant:

static void generateUniformBlockAtomicCounterBufferIndexContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ATOMIC_COUNTER_BUFFER_INDEX);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	if (!isInterfaceBlock)
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 3);
		generateOpaqueTypeCases(context, parentStructure, targetGroup, queryTarget, 3);

		// .array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayArrayElement	(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variable			(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));
			const ResourceDefinition::Node::SharedPtr	elementvariable		(new ResourceDefinition::Variable(arrayArrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));
			tcu::TestCaseGroup* const					blockGroup			= new tcu::TestCaseGroup(context.getTestContext(), "array", "Arrays");

			targetGroup->addChild(blockGroup);

			blockGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "var_array"));
			blockGroup->addChild(new ResourceTestCase(context, elementvariable, queryTarget, "var_array_array"));
		}
	}
	else
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1, false);
}